

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Al<(moira::Mode)8,_1> wrapper)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  
  SVar1 = this->style->syntax;
  if (SVar1 < (MUSASHI|MOIRA_MIT)) {
    if ((0x13U >> (SVar1 & 0x1f) & 1) == 0) {
      operator<<(this,(UInt)(wrapper.ea)->ext1);
    }
    else {
      operator<<(this,(UInt)(wrapper.ea)->ext1);
      if (this->style->syntax - MOIRA_MIT < 3) {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = 'l';
      }
      else {
        cVar3 = '.';
        lVar4 = 0;
        do {
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar3;
          cVar3 = "$%x.l"[lVar4 + 4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 2);
      }
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Al<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MOIRA_MIT:
        case Syntax::MUSASHI:

            *this << UInt(ea.ext1) << Sz<Long>{};
            break;

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << UInt(ea.ext1);
            break;
    }

    return *this;
}